

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-regex.c
# Opt level: O0

void process_regex(char *find_text,char *regex_text)

{
  undefined1 local_68 [8];
  basic_matchlist_t match_list;
  regex_t regex;
  char *regex_text_local;
  char *find_text_local;
  
  regex_compile((regex_t *)&match_list.tqh_last,regex_text);
  basic_matchlist_init((basic_matchlist_t *)local_68);
  regex_match((regex_t *)&match_list.tqh_last,find_text,(basic_matchlist_t *)local_68);
  basic_matchlist_print((basic_matchlist_t *)local_68);
  basic_matchlist_delete((basic_matchlist_t *)local_68);
  regfree((regex_t *)&match_list.tqh_last);
  return;
}

Assistant:

void process_regex(const char* find_text, const char* regex_text)
{
    regex_t regex;
    basic_matchlist_t match_list;
    regex_compile (&regex, regex_text);
    basic_matchlist_init(&match_list);
    regex_match (&regex, find_text, &match_list);
    basic_matchlist_print(&match_list);
    basic_matchlist_delete(&match_list);
    regfree (&regex);
}